

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

UfsType __thiscall
Clasp::DefaultUnfoundedCheck::findUfs(DefaultUnfoundedCheck *this,Solver *s,bool checkMin)

{
  bool bVar1;
  uint n;
  UfsType UVar2;
  reference pAVar3;
  byte in_DL;
  Solver *in_RSI;
  long in_RDI;
  NodeId head;
  undefined3 in_stack_0000002c;
  Solver *in_stack_00000040;
  DefaultUnfoundedCheck *in_stack_00000048;
  Solver *in_stack_00000058;
  DefaultUnfoundedCheck *in_stack_00000060;
  NodeId in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  Solver *this_00;
  
  updateAssignment(in_stack_00000060,in_stack_00000058);
  do {
    do {
      bVar1 = PodQueue<unsigned_int>::empty
                        ((PodQueue<unsigned_int> *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        PodQueue<unsigned_int>::clear
                  ((PodQueue<unsigned_int> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        if ((in_DL & 1) == 0) {
          return ufs_none;
        }
        UVar2 = findNonHcfUfs(in_stack_00000048,in_stack_00000040);
        return UVar2;
      }
      n = PodQueue<unsigned_int>::pop_ret((PodQueue<unsigned_int> *)0x20e711);
      pAVar3 = bk_lib::
               pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
               ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                             *)(in_RDI + 0x28),n);
      *pAVar3 = (AtomData)((uint)*pAVar3 & 0xdfffffff);
      pAVar3 = bk_lib::
               pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
               ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                             *)(in_RDI + 0x28),n);
      bVar1 = AtomData::hasSource(pAVar3);
    } while (bVar1);
    this_00 = in_RSI;
    Asp::PrgDepGraph::getAtom
              ((PrgDepGraph *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
    bVar1 = Solver::isFalse(this_00,(Literal)(uint32)((ulong)in_RDI >> 0x20));
  } while ((bVar1) || (bVar1 = findSource((DefaultUnfoundedCheck *)s,_in_stack_0000002c), bVar1));
  return ufs_poly;
}

Assistant:

DefaultUnfoundedCheck::UfsType DefaultUnfoundedCheck::findUfs(Solver& s, bool checkMin) {
	// first: remove all sources that were recently falsified
	updateAssignment(s);
	// second: try to re-establish sources.
	while (!todo_.empty()) {
		NodeId head       = todo_.pop_ret();
		atoms_[head].todo = 0;
		if (!atoms_[head].hasSource() && !s.isFalse(graph_->getAtom(head).lit) && !findSource(head)) {
			return ufs_poly;  // found an unfounded set - contained in unfounded_
		}
		assert(sourceQ_.empty());
	}
	todo_.clear();
	return !checkMin ? ufs_none : findNonHcfUfs(s);
}